

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::FBXConverter::MakeUniqueNodeName_abi_cxx11_
          (string *__return_storage_ptr__,FBXConverter *this,Model *model,aiNode *parent)

{
  string *name;
  undefined1 auVar1 [16];
  string local_68;
  undefined1 local_48 [8];
  string original_name;
  aiNode *parent_local;
  Model *model_local;
  FBXConverter *this_local;
  string *unique_name;
  
  original_name.field_2._8_8_ = parent;
  name = Object::Name_abi_cxx11_(&model->super_Object);
  FixNodeName((string *)local_48,this,name);
  auVar1 = std::__cxx11::string::empty();
  if ((auVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    getAncestorBaseName_abi_cxx11_(&local_68,(FBX *)original_name.field_2._8_8_,auVar1._8_8_);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetUniqueName(this,(string *)local_48,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::MakeUniqueNodeName(const Model* const model, const aiNode& parent)
        {
            std::string original_name = FixNodeName(model->Name());
            if (original_name.empty())
            {
                original_name = getAncestorBaseName(&parent);
            }
            std::string unique_name;
            GetUniqueName(original_name, unique_name);
            return unique_name;
        }